

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::typeName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Type type,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  Which WVar1;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  Reader brand;
  undefined1 auVar2 [40];
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  anon_union_2_2_d12d5221_for_Type_3 aVar4;
  Schema SVar5;
  uint *puVar6;
  Maybe<capnp::InterfaceSchema::Method> *method_00;
  uint uVar7;
  CppTypeName *result_1;
  StringPtr name_02;
  StringPtr name_03;
  Type type_00;
  Reader RVar8;
  StringPtr innerName;
  size_t in_stack_fffffffffffffd98;
  Type type_local;
  Fault f;
  CppTypeName *pCStack_220;
  Array<capnp::(anonymous_namespace)::CppTypeName> result;
  uint local_1e0;
  Schema local_188;
  Maybe<capnp::InterfaceSchema::Method> local_180;
  Maybe<capnp::InterfaceSchema::Method> local_138;
  Maybe<capnp::InterfaceSchema::Method> local_f0;
  Maybe<capnp::InterfaceSchema::Method> local_a8;
  Reader local_60;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  uVar7 = type._0_4_;
  if (((undefined1  [16])type & (undefined1  [16])0xff0000) != (undefined1  [16])0x0) {
    uVar7 = 0xe;
  }
  puVar6 = &switchD_0018ac35::switchdataD_0023f0e0;
  switch(uVar7 & 0xffff) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  case 7:
    break;
  case 8:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
    break;
  case 0xc:
    break;
  case 0xd:
    break;
  case 0xe:
    name.content.size_ = in_stack_fffffffffffffd98;
    name.content.ptr = (char *)0x18acaf;
    CppTypeName::makeNamespace(name);
    kj::heapArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&f,2);
    type_00 = (Type)Type::asList(&type_local);
    local_180.ptr.isSet = (method->ptr).isSet;
    if (local_180.ptr.isSet == true) {
      local_180.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_180.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_180.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_180.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_180.ptr.field_1.value.proto._reader.data =
           (method->ptr).field_1.value.proto._reader.data;
      local_180.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_180.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_180.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_180.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_180.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    typeName((CppTypeName *)&result,this,type_00,&local_180);
    CppTypeName::CppTypeName(pCStack_220,(CppTypeName *)&result);
    kj::StringTree::~StringTree((StringTree *)&result);
    WVar1 = LIST;
    if (((undefined1  [16])type_00 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar1 = type_00.baseType;
    }
    if (WVar1 < (ANY_POINTER|BOOL)) {
      name_00.content.size_ = in_stack_fffffffffffffd98;
      name_00.content.ptr = (char *)0x18ad87;
      CppTypeName::makePrimitive(name_00);
      CppTypeName::CppTypeName(pCStack_220 + 1,(CppTypeName *)&result);
      kj::StringTree::~StringTree((StringTree *)&result);
      result.size_ = (long)pCStack_220 + (0x80 - (long)f.exception) >> 6;
      result.ptr = (CppTypeName *)f.exception;
      f.exception = (Exception *)0x0;
      innerName.content.size_ = 5;
      innerName.content.ptr = "List";
      CppTypeName::addMemberTemplate(__return_storage_ptr__,innerName,&result);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&result);
      kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
                ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&f);
      return __return_storage_ptr__;
    }
    kj::_::unreachable();
  case 0xf:
    SVar5.raw = (RawBrandedSchema *)Type::asEnum(&type_local);
    local_a8.ptr.isSet = (method->ptr).isSet;
    if (local_a8.ptr.isSet == true) {
      local_a8.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_a8.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_a8.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_a8.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_a8.ptr.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data
      ;
      local_a8.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_a8.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_a8.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_a8.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_a8.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    method_00 = &local_a8;
    goto LAB_0018ae95;
  case 0x10:
    SVar5.raw = (RawBrandedSchema *)Type::asStruct(&type_local);
    local_f0.ptr.isSet = (method->ptr).isSet;
    if (local_f0.ptr.isSet == true) {
      local_f0.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_f0.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_f0.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_f0.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_f0.ptr.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data
      ;
      local_f0.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_f0.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_f0.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_f0.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_f0.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    method_00 = &local_f0;
LAB_0018ae95:
    cppFullName(__return_storage_ptr__,this,SVar5,method_00);
    return __return_storage_ptr__;
  case 0x11:
    SVar5.raw = (RawBrandedSchema *)Type::asInterface(&type_local);
    local_138.ptr.isSet = (method->ptr).isSet;
    if (local_138.ptr.isSet == true) {
      local_138.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_138.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_138.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_138.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_138.ptr.field_1.value.proto._reader.data =
           (method->ptr).field_1.value.proto._reader.data;
      local_138.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_138.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_138.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_138.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_138.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    cppFullName(__return_storage_ptr__,this,SVar5,&local_138);
    __return_storage_ptr__->hasInterfaces_ = true;
    return __return_storage_ptr__;
  case 0x12:
    Type::getBrandParameter((Maybe<capnp::Type::BrandParameter> *)&result,&type_local);
    if ((char)result.ptr == '\x01') {
      auVar2 = ZEXT1640(ZEXT816(0));
      brand._reader._40_8_ = 0x7fffffff;
      brand._reader.segment = (SegmentReader *)auVar2._0_8_;
      brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
      brand._reader.data = (void *)auVar2._16_8_;
      brand._reader.pointers = (WirePointer *)auVar2._24_8_;
      brand._reader.dataSize = auVar2._32_4_;
      brand._reader.pointerCount = auVar2._36_2_;
      brand._reader._38_2_ = auVar2._38_2_;
      local_188 = SchemaLoader::get(&this->schemaLoader,result.size_,brand,(Schema)0x2a5320);
      Schema::getProto(&local_60,&local_188);
      capnp::schema::Node::Reader::getParameters((Reader *)&f,&local_60);
      _::ListReader::getStructElement
                ((StructReader *)&result,(ListReader *)&f,(ElementCount)result.disposer);
      RVar8 = capnp::schema::Node::Parameter::Reader::getName((Reader *)&result);
      name_02.content.ptr = RVar8.super_StringPtr.content.size_;
      name_02.content.size_ = (size_t)puVar6;
      CppTypeName::makeTemplateParam
                (__return_storage_ptr__,RVar8.super_StringPtr.content.ptr,name_02);
      return __return_storage_ptr__;
    }
    Type::getImplicitParameter((Type *)&result);
    if ((char)result.ptr == '\x01') {
      if ((method->ptr).isSet == true) {
        f.exception = (Exception *)(method->ptr).field_1.value.proto._reader.segment;
        capnp::schema::Method::Reader::getImplicitParameters((Reader *)&result,(Reader *)&f);
        if (result.ptr._4_4_ < local_1e0) {
          _::ListReader::getStructElement((StructReader *)&f,(ListReader *)&result,result.ptr._4_4_)
          ;
          RVar8 = capnp::schema::Node::Parameter::Reader::getName((Reader *)&f);
          name_03.content.ptr = RVar8.super_StringPtr.content.size_;
          name_03.content.size_ = (size_t)puVar6;
          CppTypeName::makeTemplateParam
                    (__return_storage_ptr__,RVar8.super_StringPtr.content.ptr,name_03);
          return __return_storage_ptr__;
        }
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                   ,0x210,FAILED,"param->index < params.size()","");
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      aVar4.paramIndex = 0;
      if (type_local.field_4.schema == (RawBrandedSchema *)0x0) {
        aVar4.paramIndex = type_local.field_3.paramIndex;
      }
      if (type_local.isImplicitParam != false) {
        aVar4.paramIndex = 0;
      }
      switch(aVar4.paramIndex) {
      case 0:
        break;
      case 1:
        break;
      case 2:
        break;
      case 3:
        this->hasInterfaces = true;
        break;
      default:
        goto switchD_0018ac35_default;
      }
    }
    break;
  default:
switchD_0018ac35_default:
    kj::_::unreachable();
  }
  name_01.content.size_ = in_stack_fffffffffffffd98;
  name_01.content.ptr = (char *)0x18b04e;
  CppTypeName::makePrimitive(name_01);
  return __return_storage_ptr__;
}

Assistant:

CppTypeName typeName(Type type, kj::Maybe<InterfaceSchema::Method> method) {
    switch (type.which()) {
      case schema::Type::VOID: return CppTypeName::makePrimitive(" ::capnp::Void");

      case schema::Type::BOOL: return CppTypeName::makePrimitive("bool");
      case schema::Type::INT8: return CppTypeName::makePrimitive(" ::int8_t");
      case schema::Type::INT16: return CppTypeName::makePrimitive(" ::int16_t");
      case schema::Type::INT32: return CppTypeName::makePrimitive(" ::int32_t");
      case schema::Type::INT64: return CppTypeName::makePrimitive(" ::int64_t");
      case schema::Type::UINT8: return CppTypeName::makePrimitive(" ::uint8_t");
      case schema::Type::UINT16: return CppTypeName::makePrimitive(" ::uint16_t");
      case schema::Type::UINT32: return CppTypeName::makePrimitive(" ::uint32_t");
      case schema::Type::UINT64: return CppTypeName::makePrimitive(" ::uint64_t");
      case schema::Type::FLOAT32: return CppTypeName::makePrimitive("float");
      case schema::Type::FLOAT64: return CppTypeName::makePrimitive("double");

      case schema::Type::TEXT: return CppTypeName::makePrimitive(" ::capnp::Text");
      case schema::Type::DATA: return CppTypeName::makePrimitive(" ::capnp::Data");

      case schema::Type::ENUM:
        return cppFullName(type.asEnum(), method);
      case schema::Type::STRUCT:
        return cppFullName(type.asStruct(), method);
      case schema::Type::INTERFACE: {
        auto result = cppFullName(type.asInterface(), method);
        result.setHasInterfaces();
        return result;
      }

      case schema::Type::LIST: {
        CppTypeName result = CppTypeName::makeNamespace("capnp");
        auto params = kj::heapArrayBuilder<CppTypeName>(2);
        auto list = type.asList();
        params.add(typeName(list.getElementType(), method));
        params.add(whichKind(list.whichElementType()));
        result.addMemberTemplate("List", params.finish());
        return result;
      }

      case schema::Type::ANY_POINTER:
        KJ_IF_MAYBE(param, type.getBrandParameter()) {
          return CppTypeName::makeTemplateParam(schemaLoader.get(param->scopeId).getProto()
              .getParameters()[param->index].getName());
        } else KJ_IF_MAYBE(param, type.getImplicitParameter()) {
          KJ_IF_MAYBE(m, method) {
            auto params = m->getProto().getImplicitParameters();
            KJ_REQUIRE(param->index < params.size());
            return CppTypeName::makeTemplateParam(params[param->index].getName());
          } else {
            return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
          }
        } else {
          switch (type.whichAnyPointerKind()) {
            case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
              return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
            case schema::Type::AnyPointer::Unconstrained::STRUCT:
              return CppTypeName::makePrimitive(" ::capnp::AnyStruct");
            case schema::Type::AnyPointer::Unconstrained::LIST:
              return CppTypeName::makePrimitive(" ::capnp::AnyList");
            case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
              hasInterfaces = true;  // Probably need to #include <capnp/capability.h>.
              return CppTypeName::makePrimitive(" ::capnp::Capability");
          }